

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# up_xtreme.c
# Opt level: O1

mraa_board_t * mraa_upxtreme_board(void)

{
  int iVar1;
  int iVar2;
  mraa_result_t mVar3;
  mraa_board_t *board;
  mraa_pininfo_t *pmVar4;
  mraa_adv_func_t *pmVar5;
  char *pcVar6;
  mraa_pininfo_t *pin_info;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "UPXTREME";
    board->platform_version = "1.0.0";
    board->phy_pin_count = 0x29;
    board->gpio_count = 0x1c;
    board->chardev_capable = 0;
    pmVar4 = (mraa_pininfo_t *)malloc(0x7914);
    board->pins = pmVar4;
    if (pmVar4 != (mraa_pininfo_t *)0x0) {
      pmVar5 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar5;
      if (pmVar5 == (mraa_adv_func_t *)0x0) {
        free(pmVar4);
      }
      else {
        pmVar5->aio_get_valid_fp = mraa_up_aio_get_valid_fp;
        pmVar4->name[8] = '\0';
        pmVar4->name[9] = '\0';
        pmVar4->name[10] = '\0';
        pmVar4->name[0xb] = '\0';
        builtin_strncpy(pmVar4->name,"INVALID",8);
        *(undefined1 *)&pmVar4->capabilities = 0;
        (pmVar4->capabilities).field_0x3 = 0;
        *(undefined2 *)&(pmVar4->capabilities).field_0x1 = 0;
        pmVar4[1].name[8] = '\0';
        pmVar4[1].name[9] = '\0';
        pmVar4[1].name[10] = '\0';
        pmVar4[1].name[0xb] = '\0';
        pmVar4[1].name[0] = '3';
        pmVar4[1].name[1] = '.';
        pmVar4[1].name[2] = '3';
        pmVar4[1].name[3] = 'v';
        pmVar4[1].name[4] = '\0';
        pmVar4[1].name[5] = '\0';
        pmVar4[1].name[6] = '\0';
        pmVar4[1].name[7] = '\0';
        *(undefined1 *)&pmVar4[1].capabilities = 0;
        pmVar4[1].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[1].capabilities.field_0x1 = 0;
        pmVar4[2].name[0] = '5';
        pmVar4[2].name[1] = 'v';
        pmVar4[2].name[2] = '\0';
        pmVar4[2].name[3] = '\0';
        pmVar4[2].name[4] = '\0';
        pmVar4[2].name[5] = '\0';
        pmVar4[2].name[6] = '\0';
        pmVar4[2].name[7] = '\0';
        pmVar4[2].name[8] = '\0';
        pmVar4[2].name[9] = '\0';
        pmVar4[2].name[10] = '\0';
        pmVar4[2].name[0xb] = '\0';
        *(undefined1 *)&pmVar4[2].capabilities = 0;
        pmVar4[2].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[2].capabilities.field_0x1 = 0;
        pmVar4[3].name[0] = 'I';
        pmVar4[3].name[1] = '2';
        pmVar4[3].name[2] = 'C';
        pmVar4[3].name[3] = '_';
        pmVar4[3].name[4] = 'S';
        pmVar4[3].name[5] = 'D';
        pmVar4[3].name[6] = 'A';
        pmVar4[3].name[7] = '\0';
        pmVar4[3].name[8] = '\0';
        pmVar4[3].name[9] = '\0';
        pmVar4[3].name[10] = '\0';
        pmVar4[3].name[0xb] = '\0';
        *(undefined1 *)&pmVar4[3].capabilities = 0x23;
        pmVar4[3].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[3].capabilities.field_0x1 = 0;
        pmVar4[3].gpio.pinmap = 0x170;
        pmVar4[3].gpio.mux_total = 0;
        pmVar4[3].gpio.gpio_chip = 0;
        pmVar4[3].gpio.gpio_line = 0xa8;
        pmVar4[3].i2c.pinmap = 1;
        pmVar4[3].i2c.mux_total = 0;
        pmVar4[4].name[8] = '\0';
        pmVar4[4].name[9] = '\0';
        pmVar4[4].name[10] = '\0';
        pmVar4[4].name[0xb] = '\0';
        pmVar4[4].name[0] = '5';
        pmVar4[4].name[1] = 'v';
        pmVar4[4].name[2] = '\0';
        pmVar4[4].name[3] = '\0';
        pmVar4[4].name[4] = '\0';
        pmVar4[4].name[5] = '\0';
        pmVar4[4].name[6] = '\0';
        pmVar4[4].name[7] = '\0';
        *(undefined1 *)&pmVar4[4].capabilities = 0;
        pmVar4[4].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[4].capabilities.field_0x1 = 0;
        pmVar4[5].name[0] = 'I';
        pmVar4[5].name[1] = '2';
        pmVar4[5].name[2] = 'C';
        pmVar4[5].name[3] = '_';
        pmVar4[5].name[4] = 'S';
        pmVar4[5].name[5] = 'C';
        pmVar4[5].name[6] = 'L';
        pmVar4[5].name[7] = '\0';
        pmVar4[5].name[8] = '\0';
        pmVar4[5].name[9] = '\0';
        pmVar4[5].name[10] = '\0';
        pmVar4[5].name[0xb] = '\0';
        *(undefined1 *)&pmVar4[5].capabilities = 0x23;
        pmVar4[5].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[5].capabilities.field_0x1 = 0;
        pmVar4[5].gpio.pinmap = 0x171;
        pmVar4[5].gpio.mux_total = 0;
        pmVar4[5].gpio.gpio_chip = 0;
        pmVar4[5].gpio.gpio_line = 0xa9;
        pmVar4[5].i2c.pinmap = 1;
        pmVar4[5].i2c.mux_total = 0;
        pmVar4[6].name[0] = 'G';
        pmVar4[6].name[1] = 'N';
        pmVar4[6].name[2] = 'D';
        pmVar4[6].name[3] = '\0';
        pmVar4[6].name[4] = '\0';
        pmVar4[6].name[5] = '\0';
        pmVar4[6].name[6] = '\0';
        pmVar4[6].name[7] = '\0';
        pmVar4[6].name[8] = '\0';
        pmVar4[6].name[9] = '\0';
        pmVar4[6].name[10] = '\0';
        pmVar4[6].name[0xb] = '\0';
        *(undefined1 *)&pmVar4[6].capabilities = 0;
        pmVar4[6].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[6].capabilities.field_0x1 = 0;
        pmVar4[7].name[8] = '\0';
        pmVar4[7].name[9] = '\0';
        pmVar4[7].name[10] = '\0';
        pmVar4[7].name[0xb] = '\0';
        pmVar4[7].name[0] = 'A';
        pmVar4[7].name[1] = 'D';
        pmVar4[7].name[2] = 'C';
        pmVar4[7].name[3] = '0';
        pmVar4[7].name[4] = '\0';
        pmVar4[7].name[5] = '\0';
        pmVar4[7].name[6] = '\0';
        pmVar4[7].name[7] = '\0';
        *(undefined1 *)&pmVar4[7].capabilities = 0x43;
        pmVar4[7].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[7].capabilities.field_0x1 = 0;
        pmVar4[7].gpio.pinmap = 0x128;
        pmVar4[7].gpio.mux_total = 0;
        pmVar4[7].gpio.gpio_chip = 0;
        pmVar4[7].gpio.gpio_line = 0x60;
        pmVar4[7].aio.mux_total = 0;
        pmVar4[7].aio.pinmap = 0;
        pmVar4[8].name[8] = '\0';
        pmVar4[8].name[9] = '\0';
        pmVar4[8].name[10] = '\0';
        pmVar4[8].name[0xb] = '\0';
        pmVar4[8].name[0] = 'U';
        pmVar4[8].name[1] = 'A';
        pmVar4[8].name[2] = 'R';
        pmVar4[8].name[3] = 'T';
        pmVar4[8].name[4] = '_';
        pmVar4[8].name[5] = 'T';
        pmVar4[8].name[6] = 'X';
        pmVar4[8].name[7] = '\0';
        *(undefined1 *)&pmVar4[8].capabilities = 0x83;
        pmVar4[8].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[8].capabilities.field_0x1 = 0;
        pmVar4[8].gpio.pinmap = 0x1d5;
        pmVar4[8].gpio.mux_total = 0;
        pmVar4[8].gpio.gpio_chip = 0;
        pmVar4[8].gpio.gpio_line = 0x10d;
        pmVar4[8].uart.mux_total = 0;
        pmVar4[9].name[8] = '\0';
        pmVar4[9].name[9] = '\0';
        pmVar4[9].name[10] = '\0';
        pmVar4[9].name[0xb] = '\0';
        pmVar4[9].name[0] = 'G';
        pmVar4[9].name[1] = 'N';
        pmVar4[9].name[2] = 'D';
        pmVar4[9].name[3] = '\0';
        pmVar4[9].name[4] = '\0';
        pmVar4[9].name[5] = '\0';
        pmVar4[9].name[6] = '\0';
        pmVar4[9].name[7] = '\0';
        *(undefined1 *)&pmVar4[9].capabilities = 0;
        pmVar4[9].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[9].capabilities.field_0x1 = 0;
        pmVar4[10].name[8] = '\0';
        pmVar4[10].name[9] = '\0';
        pmVar4[10].name[10] = '\0';
        pmVar4[10].name[0xb] = '\0';
        pmVar4[10].name[0] = 'U';
        pmVar4[10].name[1] = 'A';
        pmVar4[10].name[2] = 'R';
        pmVar4[10].name[3] = 'T';
        pmVar4[10].name[4] = '_';
        pmVar4[10].name[5] = 'R';
        pmVar4[10].name[6] = 'X';
        pmVar4[10].name[7] = '\0';
        *(undefined1 *)&pmVar4[10].capabilities = 0x83;
        pmVar4[10].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[10].capabilities.field_0x1 = 0;
        pmVar4[10].gpio.pinmap = 0x1d4;
        pmVar4[10].gpio.mux_total = 0;
        pmVar4[10].gpio.gpio_chip = 0;
        pmVar4[10].gpio.gpio_line = 0x10c;
        pmVar4[10].uart.mux_total = 0;
        pmVar4[0xb].name[8] = '\0';
        pmVar4[0xb].name[9] = '\0';
        pmVar4[0xb].name[10] = '\0';
        pmVar4[0xb].name[0xb] = '\0';
        pmVar4[0xb].name[0] = 'U';
        pmVar4[0xb].name[1] = 'A';
        pmVar4[0xb].name[2] = 'R';
        pmVar4[0xb].name[3] = 'T';
        pmVar4[0xb].name[4] = '_';
        pmVar4[0xb].name[5] = 'R';
        pmVar4[0xb].name[6] = 'T';
        pmVar4[0xb].name[7] = 'S';
        *(undefined1 *)&pmVar4[0xb].capabilities = 0x83;
        pmVar4[0xb].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[0xb].capabilities.field_0x1 = 0;
        pmVar4[0xb].gpio.pinmap = 0x1d6;
        pmVar4[0xb].gpio.mux_total = 0;
        pmVar4[0xb].gpio.gpio_chip = 0;
        pmVar4[0xb].gpio.gpio_line = 0x10e;
        pmVar4[0xb].uart.mux_total = 0;
        pmVar4[0xc].name[8] = '\0';
        pmVar4[0xc].name[9] = '\0';
        pmVar4[0xc].name[10] = '\0';
        pmVar4[0xc].name[0xb] = '\0';
        pmVar4[0xc].name[0] = 'I';
        pmVar4[0xc].name[1] = '2';
        pmVar4[0xc].name[2] = 'S';
        pmVar4[0xc].name[3] = '_';
        pmVar4[0xc].name[4] = 'C';
        pmVar4[0xc].name[5] = 'L';
        pmVar4[0xc].name[6] = 'K';
        pmVar4[0xc].name[7] = '\0';
        *(undefined1 *)&pmVar4[0xc].capabilities = 3;
        pmVar4[0xc].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[0xc].capabilities.field_0x1 = 0;
        pmVar4[0xc].gpio.pinmap = 0x168;
        pmVar4[0xc].gpio.mux_total = 0;
        pmVar4[0xc].gpio.gpio_chip = 0;
        pmVar4[0xc].gpio.gpio_line = 0xa0;
        pmVar4[0xd].name[8] = '\0';
        pmVar4[0xd].name[9] = '\0';
        pmVar4[0xd].name[10] = '\0';
        pmVar4[0xd].name[0xb] = '\0';
        pmVar4[0xd].name[0] = 'G';
        pmVar4[0xd].name[1] = 'P';
        pmVar4[0xd].name[2] = 'I';
        pmVar4[0xd].name[3] = 'O';
        pmVar4[0xd].name[4] = '2';
        pmVar4[0xd].name[5] = '7';
        pmVar4[0xd].name[6] = '\0';
        pmVar4[0xd].name[7] = '\0';
        *(undefined1 *)&pmVar4[0xd].capabilities = 3;
        pmVar4[0xd].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[0xd].capabilities.field_0x1 = 0;
        pmVar4[0xd].gpio.pinmap = 0x10c;
        pmVar4[0xd].gpio.mux_total = 0;
        pmVar4[0xd].gpio.gpio_chip = 0;
        pmVar4[0xd].gpio.gpio_line = 0x44;
        pmVar4[0xe].name[8] = '\0';
        pmVar4[0xe].name[9] = '\0';
        pmVar4[0xe].name[10] = '\0';
        pmVar4[0xe].name[0xb] = '\0';
        pmVar4[0xe].name[0] = 'G';
        pmVar4[0xe].name[1] = 'N';
        pmVar4[0xe].name[2] = 'D';
        pmVar4[0xe].name[3] = '\0';
        pmVar4[0xe].name[4] = '\0';
        pmVar4[0xe].name[5] = '\0';
        pmVar4[0xe].name[6] = '\0';
        pmVar4[0xe].name[7] = '\0';
        *(undefined1 *)&pmVar4[0xe].capabilities = 0;
        pmVar4[0xe].capabilities.field_0x3 = 0;
        *(undefined2 *)&pmVar4[0xe].capabilities.field_0x1 = 0;
        iVar2 = board->phy_pin_count;
        if (0xf < iVar2) {
          pmVar4[0xf].name[8] = '\0';
          pmVar4[0xf].name[9] = '\0';
          pmVar4[0xf].name[10] = '\0';
          pmVar4[0xf].name[0xb] = '\0';
          pmVar4[0xf].name[0] = 'G';
          pmVar4[0xf].name[1] = 'P';
          pmVar4[0xf].name[2] = 'I';
          pmVar4[0xf].name[3] = 'O';
          pmVar4[0xf].name[4] = '2';
          pmVar4[0xf].name[5] = '2';
          pmVar4[0xf].name[6] = '\0';
          pmVar4[0xf].name[7] = '\0';
          *(undefined1 *)&pmVar4[0xf].capabilities = 3;
          pmVar4[0xf].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0xf].capabilities.field_0x1 = 0;
          pmVar4[0xf].gpio.pinmap = 0x10e;
          pmVar4[0xf].gpio.mux_total = 0;
          pmVar4[0xf].gpio.gpio_chip = 0;
          pmVar4[0xf].gpio.gpio_line = 0x46;
        }
        if (0x10 < iVar2) {
          pmVar4 = board->pins;
          pmVar4[0x10].name[8] = '\0';
          pmVar4[0x10].name[9] = '\0';
          pmVar4[0x10].name[10] = '\0';
          pmVar4[0x10].name[0xb] = '\0';
          pmVar4[0x10].name[0] = 'G';
          pmVar4[0x10].name[1] = 'P';
          pmVar4[0x10].name[2] = 'I';
          pmVar4[0x10].name[3] = 'O';
          pmVar4[0x10].name[4] = '2';
          pmVar4[0x10].name[5] = '3';
          pmVar4[0x10].name[6] = '\0';
          pmVar4[0x10].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x10].capabilities = 3;
          pmVar4[0x10].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x10].capabilities.field_0x1 = 0;
          pmVar4[0x10].gpio.pinmap = 0x108;
          pmVar4[0x10].gpio.mux_total = 0;
          pmVar4[0x10].gpio.gpio_chip = 0;
          pmVar4[0x10].gpio.gpio_line = 0x40;
        }
        if (0x11 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x11].name[8] = '\0';
          pmVar4[0x11].name[9] = '\0';
          pmVar4[0x11].name[10] = '\0';
          pmVar4[0x11].name[0xb] = '\0';
          pmVar4[0x11].name[0] = '3';
          pmVar4[0x11].name[1] = '.';
          pmVar4[0x11].name[2] = '3';
          pmVar4[0x11].name[3] = 'v';
          pmVar4[0x11].name[4] = '\0';
          pmVar4[0x11].name[5] = '\0';
          pmVar4[0x11].name[6] = '\0';
          pmVar4[0x11].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x11].capabilities = 0;
          pmVar4[0x11].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x11].capabilities.field_0x1 = 0;
        }
        if (0x12 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x12].name[8] = '\0';
          pmVar4[0x12].name[9] = '\0';
          pmVar4[0x12].name[10] = '\0';
          pmVar4[0x12].name[0xb] = '\0';
          pmVar4[0x12].name[0] = 'G';
          pmVar4[0x12].name[1] = 'P';
          pmVar4[0x12].name[2] = 'I';
          pmVar4[0x12].name[3] = 'O';
          pmVar4[0x12].name[4] = '2';
          pmVar4[0x12].name[5] = '4';
          pmVar4[0x12].name[6] = '\0';
          pmVar4[0x12].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x12].capabilities = 3;
          pmVar4[0x12].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x12].capabilities.field_0x1 = 0;
          pmVar4[0x12].gpio.pinmap = 0x109;
          pmVar4[0x12].gpio.mux_total = 0;
          pmVar4[0x12].gpio.gpio_chip = 0;
          pmVar4[0x12].gpio.gpio_line = 0x41;
        }
        if (0x13 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x13].name[0] = 'S';
          pmVar4[0x13].name[1] = 'P';
          pmVar4[0x13].name[2] = 'I';
          pmVar4[0x13].name[3] = '0';
          pmVar4[0x13].name[4] = '_';
          pmVar4[0x13].name[5] = 'M';
          pmVar4[0x13].name[6] = 'O';
          pmVar4[0x13].name[7] = 'S';
          pmVar4[0x13].name[8] = 'I';
          pmVar4[0x13].name[9] = '\0';
          pmVar4[0x13].name[10] = '\0';
          pmVar4[0x13].name[0xb] = '\0';
          *(undefined1 *)&pmVar4[0x13].capabilities = 0x13;
          pmVar4[0x13].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x13].capabilities.field_0x1 = 0;
          pmVar4[0x13].gpio.pinmap = 0x134;
          pmVar4[0x13].gpio.mux_total = 0;
          pmVar4[0x13].gpio.gpio_chip = 0;
          pmVar4[0x13].gpio.gpio_line = 0x6c;
          pmVar4[0x13].spi.mux_total = 0;
        }
        if (0x14 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x14].name[8] = '\0';
          pmVar4[0x14].name[9] = '\0';
          pmVar4[0x14].name[10] = '\0';
          pmVar4[0x14].name[0xb] = '\0';
          pmVar4[0x14].name[0] = 'G';
          pmVar4[0x14].name[1] = 'N';
          pmVar4[0x14].name[2] = 'D';
          pmVar4[0x14].name[3] = '\0';
          pmVar4[0x14].name[4] = '\0';
          pmVar4[0x14].name[5] = '\0';
          pmVar4[0x14].name[6] = '\0';
          pmVar4[0x14].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x14].capabilities = 0;
          pmVar4[0x14].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x14].capabilities.field_0x1 = 0;
        }
        if (0x15 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x15].name[0] = 'S';
          pmVar4[0x15].name[1] = 'P';
          pmVar4[0x15].name[2] = 'I';
          pmVar4[0x15].name[3] = '0';
          pmVar4[0x15].name[4] = '_';
          pmVar4[0x15].name[5] = 'M';
          pmVar4[0x15].name[6] = 'I';
          pmVar4[0x15].name[7] = 'S';
          pmVar4[0x15].name[8] = 'O';
          pmVar4[0x15].name[9] = '\0';
          pmVar4[0x15].name[10] = '\0';
          pmVar4[0x15].name[0xb] = '\0';
          *(undefined1 *)&pmVar4[0x15].capabilities = 0x13;
          pmVar4[0x15].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x15].capabilities.field_0x1 = 0;
          pmVar4[0x15].gpio.pinmap = 0x133;
          pmVar4[0x15].gpio.mux_total = 0;
          pmVar4[0x15].gpio.gpio_chip = 0;
          pmVar4[0x15].gpio.gpio_line = 0x6b;
          pmVar4[0x15].spi.mux_total = 0;
        }
        if (0x16 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x16].name[8] = '\0';
          pmVar4[0x16].name[9] = '\0';
          pmVar4[0x16].name[10] = '\0';
          pmVar4[0x16].name[0xb] = '\0';
          pmVar4[0x16].name[0] = 'G';
          pmVar4[0x16].name[1] = 'P';
          pmVar4[0x16].name[2] = 'I';
          pmVar4[0x16].name[3] = 'O';
          pmVar4[0x16].name[4] = '2';
          pmVar4[0x16].name[5] = '5';
          pmVar4[0x16].name[6] = '\0';
          pmVar4[0x16].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x16].capabilities = 3;
          pmVar4[0x16].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x16].capabilities.field_0x1 = 0;
          pmVar4[0x16].gpio.pinmap = 0x10a;
          pmVar4[0x16].gpio.mux_total = 0;
          pmVar4[0x16].gpio.gpio_chip = 0;
          pmVar4[0x16].gpio.gpio_line = 0x42;
        }
        if (0x17 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x17].name[8] = '\0';
          pmVar4[0x17].name[9] = '\0';
          pmVar4[0x17].name[10] = '\0';
          pmVar4[0x17].name[0xb] = '\0';
          pmVar4[0x17].name[0] = 'S';
          pmVar4[0x17].name[1] = 'P';
          pmVar4[0x17].name[2] = 'I';
          pmVar4[0x17].name[3] = '0';
          pmVar4[0x17].name[4] = '_';
          pmVar4[0x17].name[5] = 'C';
          pmVar4[0x17].name[6] = 'L';
          pmVar4[0x17].name[7] = 'K';
          *(undefined1 *)&pmVar4[0x17].capabilities = 0x13;
          pmVar4[0x17].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x17].capabilities.field_0x1 = 0;
          pmVar4[0x17].gpio.pinmap = 0x132;
          pmVar4[0x17].gpio.mux_total = 0;
          pmVar4[0x17].gpio.gpio_chip = 0;
          pmVar4[0x17].gpio.gpio_line = 0x6a;
          pmVar4[0x17].spi.mux_total = 0;
        }
        if (0x18 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x18].name[8] = '\0';
          pmVar4[0x18].name[9] = '\0';
          pmVar4[0x18].name[10] = '\0';
          pmVar4[0x18].name[0xb] = '\0';
          pmVar4[0x18].name[0] = 'S';
          pmVar4[0x18].name[1] = 'P';
          pmVar4[0x18].name[2] = 'I';
          pmVar4[0x18].name[3] = '0';
          pmVar4[0x18].name[4] = '_';
          pmVar4[0x18].name[5] = 'C';
          pmVar4[0x18].name[6] = 'S';
          pmVar4[0x18].name[7] = '0';
          *(undefined1 *)&pmVar4[0x18].capabilities = 0x13;
          pmVar4[0x18].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x18].capabilities.field_0x1 = 0;
          pmVar4[0x18].gpio.pinmap = 0x131;
          pmVar4[0x18].gpio.mux_total = 0;
          pmVar4[0x18].gpio.gpio_chip = 0;
          pmVar4[0x18].gpio.gpio_line = 0x69;
          pmVar4[0x18].spi.mux_total = 0;
        }
        if (0x19 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x19].name[8] = '\0';
          pmVar4[0x19].name[9] = '\0';
          pmVar4[0x19].name[10] = '\0';
          pmVar4[0x19].name[0xb] = '\0';
          pmVar4[0x19].name[0] = 'G';
          pmVar4[0x19].name[1] = 'N';
          pmVar4[0x19].name[2] = 'D';
          pmVar4[0x19].name[3] = '\0';
          pmVar4[0x19].name[4] = '\0';
          pmVar4[0x19].name[5] = '\0';
          pmVar4[0x19].name[6] = '\0';
          pmVar4[0x19].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x19].capabilities = 0;
          pmVar4[0x19].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x19].capabilities.field_0x1 = 0;
        }
        if (0x1a < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1a].name[8] = '\0';
          pmVar4[0x1a].name[9] = '\0';
          pmVar4[0x1a].name[10] = '\0';
          pmVar4[0x1a].name[0xb] = '\0';
          pmVar4[0x1a].name[0] = 'S';
          pmVar4[0x1a].name[1] = 'P';
          pmVar4[0x1a].name[2] = 'I';
          pmVar4[0x1a].name[3] = '0';
          pmVar4[0x1a].name[4] = '_';
          pmVar4[0x1a].name[5] = 'C';
          pmVar4[0x1a].name[6] = 'S';
          pmVar4[0x1a].name[7] = '1';
          *(undefined1 *)&pmVar4[0x1a].capabilities = 0x13;
          pmVar4[0x1a].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1a].capabilities.field_0x1 = 0;
          pmVar4[0x1a].gpio.pinmap = 0x137;
          pmVar4[0x1a].gpio.mux_total = 0;
          pmVar4[0x1a].gpio.gpio_chip = 0;
          pmVar4[0x1a].gpio.gpio_line = 0x6f;
          pmVar4[0x1a].spi.mux_total = 0;
        }
        if (0x1b < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1b].name[8] = '\0';
          pmVar4[0x1b].name[9] = '\0';
          pmVar4[0x1b].name[10] = '\0';
          pmVar4[0x1b].name[0xb] = '\0';
          pmVar4[0x1b].name[0] = 'I';
          pmVar4[0x1b].name[1] = 'D';
          pmVar4[0x1b].name[2] = '_';
          pmVar4[0x1b].name[3] = 'S';
          pmVar4[0x1b].name[4] = 'D';
          pmVar4[0x1b].name[5] = '\0';
          pmVar4[0x1b].name[6] = '\0';
          pmVar4[0x1b].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x1b].capabilities = 0x23;
          pmVar4[0x1b].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1b].capabilities.field_0x1 = 0;
          pmVar4[0x1b].gpio.pinmap = 0x16e;
          pmVar4[0x1b].gpio.mux_total = 0;
          pmVar4[0x1b].gpio.gpio_chip = 0;
          pmVar4[0x1b].gpio.gpio_line = 0xa6;
          pmVar4[0x1b].i2c.pinmap = 1;
          pmVar4[0x1b].i2c.mux_total = 0;
        }
        if (0x1c < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1c].name[8] = '\0';
          pmVar4[0x1c].name[9] = '\0';
          pmVar4[0x1c].name[10] = '\0';
          pmVar4[0x1c].name[0xb] = '\0';
          pmVar4[0x1c].name[0] = 'I';
          pmVar4[0x1c].name[1] = 'D';
          pmVar4[0x1c].name[2] = '_';
          pmVar4[0x1c].name[3] = 'S';
          pmVar4[0x1c].name[4] = 'C';
          pmVar4[0x1c].name[5] = '\0';
          pmVar4[0x1c].name[6] = '\0';
          pmVar4[0x1c].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x1c].capabilities = 0x23;
          pmVar4[0x1c].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1c].capabilities.field_0x1 = 0;
          pmVar4[0x1c].gpio.pinmap = 0x16f;
          pmVar4[0x1c].gpio.mux_total = 0;
          pmVar4[0x1c].gpio.gpio_chip = 0;
          pmVar4[0x1c].gpio.gpio_line = 0xa7;
          pmVar4[0x1c].i2c.pinmap = 1;
          pmVar4[0x1c].i2c.mux_total = 0;
        }
        if (0x1d < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1d].name[8] = '\0';
          pmVar4[0x1d].name[9] = '\0';
          pmVar4[0x1d].name[10] = '\0';
          pmVar4[0x1d].name[0xb] = '\0';
          pmVar4[0x1d].name[0] = 'G';
          pmVar4[0x1d].name[1] = 'P';
          pmVar4[0x1d].name[2] = 'I';
          pmVar4[0x1d].name[3] = 'O';
          pmVar4[0x1d].name[4] = '5';
          pmVar4[0x1d].name[5] = '\0';
          pmVar4[0x1d].name[6] = '\0';
          pmVar4[0x1d].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x1d].capabilities = 3;
          pmVar4[0x1d].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1d].capabilities.field_0x1 = 0;
          pmVar4[0x1d].gpio.pinmap = 0x13d;
          pmVar4[0x1d].gpio.mux_total = 0;
          pmVar4[0x1d].gpio.gpio_chip = 0;
          pmVar4[0x1d].gpio.gpio_line = 0x75;
        }
        if (0x1e < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1e].name[8] = '\0';
          pmVar4[0x1e].name[9] = '\0';
          pmVar4[0x1e].name[10] = '\0';
          pmVar4[0x1e].name[0xb] = '\0';
          pmVar4[0x1e].name[0] = 'G';
          pmVar4[0x1e].name[1] = 'N';
          pmVar4[0x1e].name[2] = 'D';
          pmVar4[0x1e].name[3] = '\0';
          pmVar4[0x1e].name[4] = '\0';
          pmVar4[0x1e].name[5] = '\0';
          pmVar4[0x1e].name[6] = '\0';
          pmVar4[0x1e].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x1e].capabilities = 0;
          pmVar4[0x1e].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1e].capabilities.field_0x1 = 0;
        }
        if (0x1f < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x1f].name[8] = '\0';
          pmVar4[0x1f].name[9] = '\0';
          pmVar4[0x1f].name[10] = '\0';
          pmVar4[0x1f].name[0xb] = '\0';
          pmVar4[0x1f].name[0] = 'G';
          pmVar4[0x1f].name[1] = 'P';
          pmVar4[0x1f].name[2] = 'I';
          pmVar4[0x1f].name[3] = 'O';
          pmVar4[0x1f].name[4] = '6';
          pmVar4[0x1f].name[5] = '\0';
          pmVar4[0x1f].name[6] = '\0';
          pmVar4[0x1f].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x1f].capabilities = 3;
          pmVar4[0x1f].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x1f].capabilities.field_0x1 = 0;
          pmVar4[0x1f].gpio.pinmap = 0x13e;
          pmVar4[0x1f].gpio.mux_total = 0;
          pmVar4[0x1f].gpio.gpio_chip = 0;
          pmVar4[0x1f].gpio.gpio_line = 0x76;
        }
        if (0x20 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x20].name[8] = '\0';
          pmVar4[0x20].name[9] = '\0';
          pmVar4[0x20].name[10] = '\0';
          pmVar4[0x20].name[0xb] = '\0';
          pmVar4[0x20].name[0] = 'G';
          pmVar4[0x20].name[1] = 'P';
          pmVar4[0x20].name[2] = 'I';
          pmVar4[0x20].name[3] = 'O';
          pmVar4[0x20].name[4] = '1';
          pmVar4[0x20].name[5] = '2';
          pmVar4[0x20].name[6] = '\0';
          pmVar4[0x20].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x20].capabilities = 3;
          pmVar4[0x20].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x20].capabilities.field_0x1 = 0;
          pmVar4[0x20].gpio.pinmap = 0x12a;
          pmVar4[0x20].gpio.mux_total = 0;
          pmVar4[0x20].gpio.gpio_chip = 0;
          pmVar4[0x20].gpio.gpio_line = 0x62;
        }
        if (0x21 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x21].name[8] = '\0';
          pmVar4[0x21].name[9] = '\0';
          pmVar4[0x21].name[10] = '\0';
          pmVar4[0x21].name[0xb] = '\0';
          pmVar4[0x21].name[0] = 'G';
          pmVar4[0x21].name[1] = 'P';
          pmVar4[0x21].name[2] = 'I';
          pmVar4[0x21].name[3] = 'O';
          pmVar4[0x21].name[4] = '1';
          pmVar4[0x21].name[5] = '3';
          pmVar4[0x21].name[6] = '\0';
          pmVar4[0x21].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x21].capabilities = 3;
          pmVar4[0x21].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x21].capabilities.field_0x1 = 0;
          pmVar4[0x21].gpio.pinmap = 299;
          pmVar4[0x21].gpio.mux_total = 0;
          pmVar4[0x21].gpio.gpio_chip = 0;
          pmVar4[0x21].gpio.gpio_line = 99;
        }
        if (0x22 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x22].name[8] = '\0';
          pmVar4[0x22].name[9] = '\0';
          pmVar4[0x22].name[10] = '\0';
          pmVar4[0x22].name[0xb] = '\0';
          pmVar4[0x22].name[0] = 'G';
          pmVar4[0x22].name[1] = 'N';
          pmVar4[0x22].name[2] = 'D';
          pmVar4[0x22].name[3] = '\0';
          pmVar4[0x22].name[4] = '\0';
          pmVar4[0x22].name[5] = '\0';
          pmVar4[0x22].name[6] = '\0';
          pmVar4[0x22].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x22].capabilities = 0;
          pmVar4[0x22].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x22].capabilities.field_0x1 = 0;
        }
        if (0x23 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x23].name[8] = '\0';
          pmVar4[0x23].name[9] = '\0';
          pmVar4[0x23].name[10] = '\0';
          pmVar4[0x23].name[0xb] = '\0';
          pmVar4[0x23].name[0] = 'I';
          pmVar4[0x23].name[1] = '2';
          pmVar4[0x23].name[2] = 'S';
          pmVar4[0x23].name[3] = '_';
          pmVar4[0x23].name[4] = 'F';
          pmVar4[0x23].name[5] = 'R';
          pmVar4[0x23].name[6] = 'M';
          pmVar4[0x23].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x23].capabilities = 3;
          pmVar4[0x23].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x23].capabilities.field_0x1 = 0;
          pmVar4[0x23].gpio.pinmap = 0x169;
          pmVar4[0x23].gpio.mux_total = 0;
          pmVar4[0x23].gpio.gpio_chip = 0;
          pmVar4[0x23].gpio.gpio_line = 0xa1;
        }
        if (0x24 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x24].name[8] = '\0';
          pmVar4[0x24].name[9] = '\0';
          pmVar4[0x24].name[10] = '\0';
          pmVar4[0x24].name[0xb] = '\0';
          pmVar4[0x24].name[0] = 'U';
          pmVar4[0x24].name[1] = 'A';
          pmVar4[0x24].name[2] = 'R';
          pmVar4[0x24].name[3] = 'T';
          pmVar4[0x24].name[4] = '_';
          pmVar4[0x24].name[5] = 'C';
          pmVar4[0x24].name[6] = 'T';
          pmVar4[0x24].name[7] = 'S';
          *(undefined1 *)&pmVar4[0x24].capabilities = 0x83;
          pmVar4[0x24].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x24].capabilities.field_0x1 = 0;
          pmVar4[0x24].gpio.pinmap = 0x1d7;
          pmVar4[0x24].gpio.mux_total = 0;
          pmVar4[0x24].gpio.gpio_chip = 0;
          pmVar4[0x24].gpio.gpio_line = 0x10f;
          pmVar4[0x24].uart.mux_total = 0;
        }
        if (0x25 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x25].name[8] = '\0';
          pmVar4[0x25].name[9] = '\0';
          pmVar4[0x25].name[10] = '\0';
          pmVar4[0x25].name[0xb] = '\0';
          pmVar4[0x25].name[0] = 'G';
          pmVar4[0x25].name[1] = 'P';
          pmVar4[0x25].name[2] = 'I';
          pmVar4[0x25].name[3] = 'O';
          pmVar4[0x25].name[4] = '2';
          pmVar4[0x25].name[5] = '6';
          pmVar4[0x25].name[6] = '\0';
          pmVar4[0x25].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x25].capabilities = 3;
          pmVar4[0x25].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x25].capabilities.field_0x1 = 0;
          pmVar4[0x25].gpio.pinmap = 0x10b;
          pmVar4[0x25].gpio.mux_total = 0;
          pmVar4[0x25].gpio.gpio_chip = 0;
          pmVar4[0x25].gpio.gpio_line = 0x43;
        }
        if (0x26 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x26].name[8] = '\0';
          pmVar4[0x26].name[9] = '\0';
          pmVar4[0x26].name[10] = '\0';
          pmVar4[0x26].name[0xb] = '\0';
          pmVar4[0x26].name[0] = 'I';
          pmVar4[0x26].name[1] = '2';
          pmVar4[0x26].name[2] = 'S';
          pmVar4[0x26].name[3] = '_';
          pmVar4[0x26].name[4] = 'D';
          pmVar4[0x26].name[5] = 'I';
          pmVar4[0x26].name[6] = 'N';
          pmVar4[0x26].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x26].capabilities = 3;
          pmVar4[0x26].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x26].capabilities.field_0x1 = 0;
          pmVar4[0x26].gpio.pinmap = 0x16b;
          pmVar4[0x26].gpio.mux_total = 0;
          pmVar4[0x26].gpio.gpio_chip = 0;
          pmVar4[0x26].gpio.gpio_line = 0xa3;
        }
        if (0x27 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x27].name[8] = '\0';
          pmVar4[0x27].name[9] = '\0';
          pmVar4[0x27].name[10] = '\0';
          pmVar4[0x27].name[0xb] = '\0';
          pmVar4[0x27].name[0] = 'G';
          pmVar4[0x27].name[1] = 'N';
          pmVar4[0x27].name[2] = 'D';
          pmVar4[0x27].name[3] = '\0';
          pmVar4[0x27].name[4] = '\0';
          pmVar4[0x27].name[5] = '\0';
          pmVar4[0x27].name[6] = '\0';
          pmVar4[0x27].name[7] = '\0';
          *(undefined1 *)&pmVar4[0x27].capabilities = 0;
          pmVar4[0x27].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x27].capabilities.field_0x1 = 0;
        }
        if (0x28 < board->phy_pin_count) {
          pmVar4 = board->pins;
          pmVar4[0x28].name[8] = '\0';
          pmVar4[0x28].name[9] = '\0';
          pmVar4[0x28].name[10] = '\0';
          pmVar4[0x28].name[0xb] = '\0';
          pmVar4[0x28].name[0] = 'I';
          pmVar4[0x28].name[1] = '2';
          pmVar4[0x28].name[2] = 'S';
          pmVar4[0x28].name[3] = '_';
          pmVar4[0x28].name[4] = 'D';
          pmVar4[0x28].name[5] = 'O';
          pmVar4[0x28].name[6] = 'U';
          pmVar4[0x28].name[7] = 'T';
          *(undefined1 *)&pmVar4[0x28].capabilities = 3;
          pmVar4[0x28].capabilities.field_0x3 = 0;
          *(undefined2 *)&pmVar4[0x28].capabilities.field_0x1 = 0;
          pmVar4[0x28].gpio.pinmap = 0x16a;
          pmVar4[0x28].gpio.mux_total = 0;
          pmVar4[0x28].gpio.gpio_chip = 0;
          pmVar4[0x28].gpio.gpio_line = 0xa2;
        }
        board->i2c_bus_count = 0;
        board->def_i2c_bus = 0;
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:19.0","i2c_designware.3");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C0 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"I2C_SDA",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"I2C_SCL",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        iVar2 = mraa_find_i2c_bus_pci("0000:00","0000:00:15.3","i2c_designware.2");
        if (iVar2 == -1) {
          syslog(4,"UP Xtreme: Platform failed to find I2C1 controller");
        }
        else {
          iVar1 = board->i2c_bus_count;
          board->i2c_bus[iVar1].bus_id = iVar2;
          mraa_upxtreme_get_pin_index(board,"ID_SD",&board->i2c_bus[iVar1].sda);
          mraa_upxtreme_get_pin_index(board,"ID_SC",&board->i2c_bus[iVar1].scl);
          board->i2c_bus_count = board->i2c_bus_count + 1;
        }
        board->pwm_dev_count = 0;
        board->spi_bus_count = 0;
        board->def_spi_bus = 0;
        board->spi_bus[0].bus_id = 0;
        board->spi_bus[0].slave_s = 0;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS0",&board->spi_bus[0].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[0].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[0].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[0].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->spi_bus[1].bus_id = 0;
        board->spi_bus[1].slave_s = 1;
        mraa_upxtreme_get_pin_index(board,"SPI0_CS1",&board->spi_bus[1].cs);
        mraa_upxtreme_get_pin_index(board,"SPI0_MOSI",&board->spi_bus[1].mosi);
        mraa_upxtreme_get_pin_index(board,"SPI0_MISO",&board->spi_bus[1].miso);
        mraa_upxtreme_get_pin_index(board,"SPI0_CLK",&board->spi_bus[1].sclk);
        board->spi_bus_count = board->spi_bus_count + 1;
        board->uart_dev_count = 0;
        board->def_uart_dev = 0;
        mVar3 = mraa_find_uart_bus_pci
                          ("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                           &board->uart_dev[0].device_path);
        if (mVar3 == MRAA_SUCCESS) {
          mraa_upxtreme_get_pin_index(board,"UART_RX",&board->uart_dev[0].rx);
          mraa_upxtreme_get_pin_index(board,"UART_TX",&board->uart_dev[0].tx);
          mraa_upxtreme_get_pin_index(board,"UART_CTS",&board->uart_dev[0].cts);
          mraa_upxtreme_get_pin_index(board,"UART_RTS",&board->uart_dev[0].rts);
          board->uart_dev_count = board->uart_dev_count + 1;
        }
        else {
          syslog(4,"UP Xtreme: Platform failed to find uart controller");
        }
        board->aio_count = 1;
        board->adc_raw = 8;
        board->adc_supported = 8;
        board->aio_non_seq = 1;
        mraa_upxtreme_get_pin_index(board,"ADC0",(int *)board->aio_dev);
        iVar2 = access("/sys/bus/platform/drivers/upboard-pinctrl",0);
        pcVar6 = "";
        if (iVar2 == -1) {
          pcVar6 = "un";
        }
        syslog(5,"UP Xtreme: kernel pinctrl driver %savailable",pcVar6);
        if (iVar2 != -1) {
          return board;
        }
      }
    }
    syslog(2,"UP Xtreme: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_upxtreme_board()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof (mraa_board_t));

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->platform_version = PLATFORM_VERSION;
    b->phy_pin_count = MRAA_UPXTREME_PINCOUNT;
    b->gpio_count = MRAA_UPXTREME_GPIOCOUNT;
    b->chardev_capable = 0;

    b->pins = (mraa_pininfo_t*) malloc(sizeof(mraa_pininfo_t) * MRAA_UPXTREME_PINCOUNT);
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t *) calloc(1, sizeof (mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    b->adv_func->aio_get_valid_fp = &mraa_up_aio_get_valid_fp;

    mraa_upxtreme_set_pininfo(b, 0, "INVALID",    (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 1, "3.3v",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 2, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 3, "I2C_SDA",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 168, 0, 168);
    mraa_upxtreme_set_pininfo(b, 4, "5v",         (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 5, "I2C_SCL",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 169, 0, 169);
    mraa_upxtreme_set_pininfo(b, 6, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 7, "ADC0",       (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 1, 0}, MRAA_UPXTREME_CHIP_BASE + 96, 0, 96);
    mraa_upxtreme_set_pininfo(b, 8, "UART_TX",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 269, 0, 269);
    mraa_upxtreme_set_pininfo(b, 9, "GND",        (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 10, "UART_RX",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 268, 0, 268);
    mraa_upxtreme_set_pininfo(b, 11, "UART_RTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 270, 0, 270);
    mraa_upxtreme_set_pininfo(b, 12, "I2S_CLK",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 160, 0, 160);
    mraa_upxtreme_set_pininfo(b, 13, "GPIO27",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 68, 0, 68);
    mraa_upxtreme_set_pininfo(b, 14, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 15, "GPIO22",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 70, 0, 70);
    mraa_upxtreme_set_pininfo(b, 16, "GPIO23",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 64, 0, 64);
    mraa_upxtreme_set_pininfo(b, 17, "3.3v",      (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 18, "GPIO24",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 65, 0, 65);
    mraa_upxtreme_set_pininfo(b, 19, "SPI0_MOSI", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 108, 0, 108);
    mraa_upxtreme_set_pininfo(b, 20, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 21, "SPI0_MISO", (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 107, 0, 107);
    mraa_upxtreme_set_pininfo(b, 22, "GPIO25",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 66, 0, 66);
    mraa_upxtreme_set_pininfo(b, 23, "SPI0_CLK",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 106, 0, 106);
    mraa_upxtreme_set_pininfo(b, 24, "SPI0_CS0",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 105, 0, 105);
    mraa_upxtreme_set_pininfo(b, 25, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 26, "SPI0_CS1",  (mraa_pincapabilities_t) {1, 1, 0, 0, 1, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 111, 0, 111);
    mraa_upxtreme_set_pininfo(b, 27, "ID_SD",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 166, 0, 166);
    mraa_upxtreme_set_pininfo(b, 28, "ID_SC",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 1, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 167, 0, 167);
    mraa_upxtreme_set_pininfo(b, 29, "GPIO5",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 117, 0, 117);
    mraa_upxtreme_set_pininfo(b, 30, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 31, "GPIO6",     (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 118, 0, 118);
    mraa_upxtreme_set_pininfo(b, 32, "GPIO12",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 98, 0, 98);
    mraa_upxtreme_set_pininfo(b, 33, "GPIO13",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 99, 0, 99);
    mraa_upxtreme_set_pininfo(b, 34, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 35, "I2S_FRM",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 161, 0, 161);
    mraa_upxtreme_set_pininfo(b, 36, "UART_CTS",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 1}, MRAA_UPXTREME_CHIP_BASE + 271, 0, 271);
    mraa_upxtreme_set_pininfo(b, 37, "GPIO26",    (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 67, 0, 67);
    mraa_upxtreme_set_pininfo(b, 38, "I2S_DIN",   (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 163, 0, 163);
    mraa_upxtreme_set_pininfo(b, 39, "GND",       (mraa_pincapabilities_t) {0, 0, 0, 0, 0, 0, 0, 0}, -1, -1, -1);
    mraa_upxtreme_set_pininfo(b, 40, "I2S_DOUT",  (mraa_pincapabilities_t) {1, 1, 0, 0, 0, 0, 0, 0}, MRAA_UPXTREME_CHIP_BASE + 162, 0, 162);

    b->i2c_bus_count = 0;
    b->def_i2c_bus = 0;
    int i2c_bus_num;

    // Configure I2C adaptor #0 (default)
    // (For consistency with Raspberry Pi 2, use I2C1 as our primary I2C bus)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:19.0", "i2c_designware.3");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "I2C_SDA", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "I2C_SCL", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C0 controller");
    }

    // Configure I2C adaptor #1
    // (normally reserved for accessing HAT EEPROM)
    i2c_bus_num = mraa_find_i2c_bus_pci("0000:00", "0000:00:15.3", "i2c_designware.2");
    if (i2c_bus_num != -1) {
        int i = b->i2c_bus_count;
        b->i2c_bus[i].bus_id = i2c_bus_num;
        mraa_upxtreme_get_pin_index(b, "ID_SD", &(b->i2c_bus[i].sda));
        mraa_upxtreme_get_pin_index(b, "ID_SC", &(b->i2c_bus[i].scl));
        b->i2c_bus_count++;
    } else {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find I2C1 controller");
    }

    // Configure PWM
    b->pwm_dev_count = 0;

    // Configure SPI
    b->spi_bus_count = 0;
    b->def_spi_bus = 0;

    // Configure SPI #0 CS0 (default)
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS0",  &(b->spi_bus[0].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[0].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[0].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[0].sclk));
    b->spi_bus_count++;

    // Configure SPI #0 CS1
    b->spi_bus[1].bus_id = 0;
    b->spi_bus[1].slave_s = 1;
    mraa_upxtreme_get_pin_index(b, "SPI0_CS1",  &(b->spi_bus[1].cs));
    mraa_upxtreme_get_pin_index(b, "SPI0_MOSI", &(b->spi_bus[1].mosi));
    mraa_upxtreme_get_pin_index(b, "SPI0_MISO", &(b->spi_bus[1].miso));
    mraa_upxtreme_get_pin_index(b, "SPI0_CLK",  &(b->spi_bus[1].sclk));
    b->spi_bus_count++;

    // Configure UART
    b->uart_dev_count = 0;
    b->def_uart_dev = 0;
    // setting up a default path
    if (mraa_find_uart_bus_pci("/sys/bus/pci/devices/0000:00:1e.1/dw-apb-uart.6/tty/",
                               &(b->uart_dev[0].device_path)) != MRAA_SUCCESS) {
        syslog(LOG_WARNING, "UP Xtreme: Platform failed to find uart controller");
    } else {
        // Configure UART #1 (default)
        mraa_upxtreme_get_pin_index(b, "UART_RX", &(b->uart_dev[0].rx));
        mraa_upxtreme_get_pin_index(b, "UART_TX", &(b->uart_dev[0].tx));
        mraa_upxtreme_get_pin_index(b, "UART_CTS", &(b->uart_dev[0].cts));
        mraa_upxtreme_get_pin_index(b, "UART_RTS", &(b->uart_dev[0].rts));
        b->uart_dev_count++;
    }

    // Configure ADC #0
    b->aio_count = 1;
    b->adc_raw = 8;
    b->adc_supported = 8;
    b->aio_non_seq = 1;
    mraa_upxtreme_get_pin_index(b, "ADC0", (int*) &(b->aio_dev[0].pin));

    const char* pinctrl_path = "/sys/bus/platform/drivers/upboard-pinctrl";
    int have_pinctrl = access(pinctrl_path, F_OK) != -1;
    syslog(LOG_NOTICE, "UP Xtreme: kernel pinctrl driver %savailable", have_pinctrl ? "" : "un");

    if (have_pinctrl)
        return b;

error:
    syslog(LOG_CRIT, "UP Xtreme: Platform failed to initialise");
    free(b);
    return NULL;
}